

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

Matcher<const_phmap::btree_set<int,_phmap::Less<int>,_std::allocator<int>_>_&> * __thiscall
testing::internal::ElementsAreMatcher::operator_cast_to_Matcher
          (Matcher<const_phmap::btree_set<int,_phmap::Less<int>,_std::allocator<int>_>_&>
           *__return_storage_ptr__,ElementsAreMatcher *this)

{
  ElementsAreMatcherImpl<phmap::btree_set<int,phmap::Less<int>,std::allocator<int>>const&> *this_00;
  MatcherVec matchers;
  
  matchers.
  super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  matchers.
  super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  matchers.
  super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>::
  reserve(&matchers,5);
  TransformTupleValuesHelper<std::tuple<int,_int,_int,_int,_int>,_testing::internal::CastAndAppendTransform<const_int_&>,_std::back_insert_iterator<std::vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>_>_>
  ::Run(this,&matchers);
  this_00 = (ElementsAreMatcherImpl<phmap::btree_set<int,phmap::Less<int>,std::allocator<int>>const&>
             *)operator_new(0x20);
  ElementsAreMatcherImpl<phmap::btree_set<int,phmap::Less<int>,std::allocator<int>>const&>::
  ElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<testing::Matcher<int_const&>*,std::vector<testing::Matcher<int_const&>,std::allocator<testing::Matcher<int_const&>>>>>
            (this_00,(__normal_iterator<testing::Matcher<const_int_&>_*,_std::vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>_>
                      )matchers.
                       super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<testing::Matcher<const_int_&>_*,_std::vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>_>
              )matchers.
               super__Vector_base<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  Matcher<const_phmap::btree_set<int,_phmap::Less<int>,_std::allocator<int>_>_&>::Matcher
            (__return_storage_ptr__,
             (MatcherInterface<const_phmap::btree_set<int,_phmap::Less<int>,_std::allocator<int>_>_&>
              *)this_00);
  std::vector<testing::Matcher<const_int_&>,_std::allocator<testing::Matcher<const_int_&>_>_>::
  ~vector(&matchers);
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<Container>() const {
    static_assert(
        !IsHashTable<GTEST_REMOVE_REFERENCE_AND_CONST_(Container)>::value ||
            ::std::tuple_size<MatcherTuple>::value < 2,
        "use UnorderedElementsAre with hash tables");

    typedef GTEST_REMOVE_REFERENCE_AND_CONST_(Container) RawContainer;
    typedef typename internal::StlContainerView<RawContainer>::type View;
    typedef typename View::value_type Element;
    typedef ::std::vector<Matcher<const Element&>> MatcherVec;
    MatcherVec matchers;
    matchers.reserve(::std::tuple_size<MatcherTuple>::value);
    TransformTupleValues(CastAndAppendTransform<const Element&>(), matchers_,
                         ::std::back_inserter(matchers));
    return Matcher<Container>(new ElementsAreMatcherImpl<const Container&>(
        matchers.begin(), matchers.end()));
  }